

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_bin.h
# Opt level: O2

void cache_bin_finish_flush(cache_bin_t *bin,cache_bin_ptr_array_t *arr,cache_bin_sz_t nflushed)

{
  ulong uVar1;
  void **ppvVar2;
  
  ppvVar2 = bin->stack_head;
  uVar1 = (ulong)(uint)((int)arr << 3);
  memmove((void *)((long)ppvVar2 + uVar1),ppvVar2,
          (ulong)(((*(int *)&bin->low_bits_empty - (int)ppvVar2 & 0xffffU) >> 3) - (int)arr) << 3);
  ppvVar2 = (void **)(uVar1 + (long)bin->stack_head);
  bin->stack_head = ppvVar2;
  if ((ushort)((*(int *)&bin->low_bits_empty - (int)ppvVar2 & 0xffffU) >> 3) <
      (ushort)((short)*(int *)&bin->low_bits_empty - bin->low_bits_low_water) >> 3) {
    bin->low_bits_low_water = (uint16_t)ppvVar2;
  }
  return;
}

Assistant:

static inline void
cache_bin_finish_flush(cache_bin_t *bin, cache_bin_ptr_array_t *arr,
    cache_bin_sz_t nflushed) {
	unsigned rem = cache_bin_ncached_get_local(bin) - nflushed;
	memmove(bin->stack_head + nflushed, bin->stack_head,
	    rem * sizeof(void *));
	bin->stack_head += nflushed;
	cache_bin_low_water_adjust(bin);
}